

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O2

void __thiscall csv::CSVReader::~CSVReader(CSVReader *this)

{
  if ((this->read_csv_worker)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::thread::~thread(&this->read_csv_worker);
  std::
  unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
  ::~unique_ptr(&this->records);
  std::
  unique_ptr<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
  ::~unique_ptr(&this->parser);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->col_names).
              super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  CSVFormat::~CSVFormat(&this->_format);
  return;
}

Assistant:

~CSVReader() {
            if (this->read_csv_worker.joinable()) {
                this->read_csv_worker.join();
            }
        }